

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

void __thiscall Potassco::TheoryData::DestroyT::operator()(DestroyT *this,TheoryTerm *t)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  TheoryTerm *in_RSI;
  DestroyT *in_RDI;
  FuncData *in_stack_ffffffffffffffd8;
  Theory_t local_18;
  Theory_t local_14 [5];
  
  bVar1 = TheoryTerm::valid(in_RSI);
  if (bVar1) {
    local_14[0] = TheoryTerm::type((TheoryTerm *)in_stack_ffffffffffffffd8);
    uVar2 = Theory_t::operator_cast_to_unsigned_int(local_14);
    if (uVar2 == 2) {
      TheoryTerm::func((TheoryTerm *)0x142b5f);
      operator()(in_RDI,in_stack_ffffffffffffffd8);
    }
    else {
      local_18 = TheoryTerm::type((TheoryTerm *)in_stack_ffffffffffffffd8);
      uVar2 = Theory_t::operator_cast_to_unsigned_int(&local_18);
      if ((uVar2 == 1) && (pcVar3 = TheoryTerm::symbol((TheoryTerm *)in_RDI), pcVar3 != (char *)0x0)
         ) {
        operator_delete__(pcVar3);
      }
    }
  }
  return;
}

Assistant:

void operator()(TheoryTerm& t) const {
		if (t.valid()) {
			if (t.type() == Theory_t::Compound) {
				this->operator()(t.func());
			}
			else if (t.type() == Theory_t::Symbol) {
				delete[] const_cast<char*>(t.symbol());
			}
		}
	}